

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O2

void njoy::ENDFtk::section::FissionYieldData::verifySize(int NPL,int NFP)

{
  char *in_RAX;
  undefined8 *puVar1;
  
  if (NFP * 4 == NPL) {
    return;
  }
  tools::Log::error<char_const*>(in_RAX);
  tools::Log::info<char_const*>(in_RAX);
  tools::Log::info<char_const*,int>("NPL value: {}",NPL);
  tools::Log::info<char_const*,int>("NFP value: {}",NFP);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NPL, int NFP ) {

  if ( NPL != NFP * 4 ) {

    Log::error( "Encountered illegal NPL and NFP values " );
    Log::info( "NPL must be equal to 4*NFP for fission yield data" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NFP value: {}", NFP );
    throw std::exception();
  }
}